

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O0

Vec_Int_t * Wlc_NtkCollectMultipliers(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  Vec_Int_t *vBoxIds;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  p_local = (Wlc_Ntk_t *)Vec_IntAlloc(100);
  for (vBoxIds._4_4_ = 1; iVar1 = Wlc_NtkObjNumMax(p), vBoxIds._4_4_ < iVar1;
      vBoxIds._4_4_ = vBoxIds._4_4_ + 1) {
    pWVar2 = Wlc_NtkObj(p,vBoxIds._4_4_);
    if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x2d) {
      Vec_IntPush((Vec_Int_t *)p_local,vBoxIds._4_4_);
    }
  }
  iVar1 = Vec_IntSize((Vec_Int_t *)p_local);
  if (iVar1 < 1) {
    Vec_IntFree((Vec_Int_t *)p_local);
    p_local = (Wlc_Ntk_t *)0x0;
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMultipliers( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;  int i;
    Vec_Int_t * vBoxIds = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            Vec_IntPush( vBoxIds, i );
    if ( Vec_IntSize( vBoxIds ) > 0 )
        return vBoxIds;
    Vec_IntFree( vBoxIds );
    return NULL;
}